

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

int __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::remove(HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
         *this,char *__filename)

{
  interval_t *right;
  interval_t *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNVar3;
  pair<unsigned_long,_duckdb::interval_t> *in_RDX;
  long extraout_RDX;
  long lVar4;
  pair<unsigned_long,_duckdb::interval_t> *__filename_00;
  char *__filename_01;
  
  _throwIfValueDoesNotCompare
            ((HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
              *)__filename,in_RDX);
  lVar4 = *(long *)(__filename + 0x18) - *(long *)(__filename + 0x10);
  __filename_01 = (char *)(lVar4 >> 4);
  while( true ) {
    __filename_01 = __filename_01 + -1;
    lVar4 = lVar4 + -0x10;
    if (__filename_01 == (char *)0xffffffffffffffff) break;
    iVar2 = Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
            ::remove(*(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                       **)(*(long *)(__filename + 0x10) + lVar4),__filename_01);
    pNVar3 = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
              *)CONCAT44(extraout_var,iVar2);
    if (pNVar3 != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                   *)0x0) {
      _adjRemoveRefs((HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                      *)__filename,(pNVar3->_nodeRefs)._swapLevel,pNVar3);
      *(long *)(__filename + 8) = *(long *)(__filename + 8) + -1;
      Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
      ::_Pool::Release((pair<unsigned_long,_duckdb::interval_t> *)this,(_Pool *)(__filename + 0x38),
                       pNVar3);
      return (int)this;
    }
  }
  _throwValueErrorNotFound
            ((HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
              *)__filename,in_RDX);
  right = (interval_t *)(extraout_RDX + 8);
  this_00 = &(((Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                *)__filename)->_value).second;
  bVar1 = duckdb::interval_t::operator>(this_00,right);
  if (!bVar1) {
    lVar4 = (long)in_RDX << 4;
    for (__filename_00 = in_RDX;
        __filename_00 != (pair<unsigned_long,_duckdb::interval_t> *)0xffffffffffffffff;
        __filename_00 =
             (pair<unsigned_long,_duckdb::interval_t> *)((long)&__filename_00[-1].second.micros + 7)
        ) {
      pNVar3 = *(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                 **)((long)&((((Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                                *)__filename)->_nodeRefs)._nodes.
                             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->pNode + lVar4);
      if (pNVar3 != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                     *)0x0) {
        iVar2 = Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                ::remove(pNVar3,(char *)__filename_00);
        if ((Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
             *)CONCAT44(extraout_var_00,iVar2) !=
            (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
             *)0x0) {
          pNVar3 = Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                   ::_adjRemoveRefs((Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                                     *)__filename,(size_t)__filename_00,
                                    (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                                     *)CONCAT44(extraout_var_00,iVar2));
          return (int)pNVar3;
        }
      }
      lVar4 = lVar4 + -0x10;
    }
  }
  if (in_RDX == (pair<unsigned_long,_duckdb::interval_t> *)0x0) {
    bVar1 = duckdb::interval_t::operator>(this_00,right);
    if (!bVar1) {
      bVar1 = duckdb::interval_t::operator>(right,this_00);
      if (!bVar1) {
        (((Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
           *)__filename)->_nodeRefs)._swapLevel = 0;
        goto LAB_00bb04f5;
      }
    }
  }
  __filename = (char *)0x0;
LAB_00bb04f5:
  return (int)__filename;
}

Assistant:

T HeadNode<T, _Compare>::remove(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level;

    _throwIfValueDoesNotCompare(value);
    for (level = _nodeRefs.height(); level-- > 0;) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->remove(level, value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        _throwValueErrorNotFound(value);
    }
    // Take swap level as some swaps will have been dealt with by the remove() above.
    _adjRemoveRefs(pNode->nodeRefs().swapLevel(), pNode);
    --_count;
    T ret_val = _pool.Release(pNode);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
    return ret_val;
}